

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_env_share_locks(MDB_env *env,int *excl)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  undefined2 local_48;
  undefined2 local_46;
  flock lock_info;
  MDB_meta *meta;
  int rc;
  int *excl_local;
  MDB_env *env_local;
  
  lock_info._24_8_ = mdb_env_pick_meta(env);
  (env->me_txns->mt1).mtb.mtb_txnid = ((MDB_meta *)lock_info._24_8_)->mm_txnid;
  memset(&local_48,0,0x20);
  local_48 = 0;
  local_46 = 0;
  lock_info.l_type = 0;
  lock_info.l_whence = 0;
  lock_info._4_4_ = 0;
  lock_info.l_start = 1;
  do {
    meta._4_4_ = fcntl(env->me_lfd,6,&local_48);
    bVar3 = false;
    if (meta._4_4_ != 0) {
      piVar1 = __errno_location();
      meta._4_4_ = *piVar1;
      bVar3 = meta._4_4_ == 4;
    }
  } while (bVar3);
  iVar2 = 0;
  if (meta._4_4_ != 0) {
    iVar2 = -1;
  }
  *excl = iVar2;
  return meta._4_4_;
}

Assistant:

static int ESECT
mdb_env_share_locks(MDB_env *env, int *excl)
{
	int rc = 0;
	MDB_meta *meta = mdb_env_pick_meta(env);

	env->me_txns->mti_txnid = meta->mm_txnid;

#ifdef _WIN32
	{
		OVERLAPPED ov;
		/* First acquire a shared lock. The Unlock will
		 * then release the existing exclusive lock.
		 */
		memset(&ov, 0, sizeof(ov));
		if (!LockFileEx(env->me_lfd, 0, 0, 1, 0, &ov)) {
			rc = ErrCode();
		} else {
			UnlockFile(env->me_lfd, 0, 0, 1, 0);
			*excl = 0;
		}
	}
#else
	{
		struct flock lock_info;
		/* The shared lock replaces the existing lock */
		memset((void *)&lock_info, 0, sizeof(lock_info));
		lock_info.l_type = F_RDLCK;
		lock_info.l_whence = SEEK_SET;
		lock_info.l_start = 0;
		lock_info.l_len = 1;
		while ((rc = fcntl(env->me_lfd, F_SETLK, &lock_info)) &&
				(rc = ErrCode()) == EINTR) ;
		*excl = rc ? -1 : 0;	/* error may mean we lost the lock */
	}
#endif

	return rc;
}